

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O2

LazyObject * __thiscall Assimp::STEP::DB::MustGetObject(DB *this,uint64_t id)

{
  LazyObject *pLVar1;
  TypeError *this_00;
  allocator<char> local_39;
  string local_38;
  
  pLVar1 = GetObject(this,id);
  if (pLVar1 != (LazyObject *)0x0) {
    return pLVar1;
  }
  this_00 = (TypeError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"requested entity is not present",&local_39);
  TypeError::TypeError(this_00,&local_38,id,0xffffffffffffffff);
  __cxa_throw(this_00,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const LazyObject& MustGetObject(uint64_t id) const {
            const LazyObject* o = GetObject(id);
            if (!o) {
                throw TypeError("requested entity is not present",id);
            }
            return *o;
        }